

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::decode_url(string *__return_storage_ptr__,string *s)

{
  ulong i_00;
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  size_t sVar4;
  char cVar5;
  size_t i;
  ulong uVar6;
  int val_1;
  int val;
  char buff [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (uVar6 = 0; uVar6 < s->_M_string_length; uVar6 = uVar6 + 1) {
    pcVar2 = (s->_M_dataplus)._M_p;
    cVar1 = pcVar2[uVar6];
    cVar5 = (char)__return_storage_ptr__;
    if (((cVar1 == '+') || (cVar1 != '%')) || (i_00 = uVar6 + 1, s->_M_string_length <= i_00)) {
      std::__cxx11::string::push_back(cVar5);
    }
    else if (pcVar2[i_00] == 'u') {
      val = 0;
      bVar3 = from_hex_to_i(s,uVar6 + 2,4,&val);
      if (bVar3) {
        sVar4 = to_utf8(val,buff);
        if (sVar4 != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)buff);
        }
        uVar6 = uVar6 + 5;
      }
      else {
        std::__cxx11::string::push_back(cVar5);
      }
    }
    else {
      val_1 = 0;
      bVar3 = from_hex_to_i(s,i_00,2,&val_1);
      if (bVar3) {
        std::__cxx11::string::push_back(cVar5);
        uVar6 = uVar6 + 2;
      }
      else {
        std::__cxx11::string::push_back(cVar5);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string decode_url(const std::string &s) {
  std::string result;

  for (size_t i = 0; i < s.size(); i++) {
    if (s[i] == '%' && i + 1 < s.size()) {
      if (s[i + 1] == 'u') {
        int val = 0;
        if (from_hex_to_i(s, i + 2, 4, val)) {
          // 4 digits Unicode codes
          char buff[4];
          size_t len = to_utf8(val, buff);
          if (len > 0) { result.append(buff, len); }
          i += 5; // 'u0000'
        } else {
          result += s[i];
        }
      } else {
        int val = 0;
        if (from_hex_to_i(s, i + 1, 2, val)) {
          // 2 digits hex codes
          result += static_cast<char>(val);
          i += 2; // '00'
        } else {
          result += s[i];
        }
      }
    } else if (s[i] == '+') {
      result += ' ';
    } else {
      result += s[i];
    }
  }

  return result;
}